

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int JS_PreventExtensions(JSContext *ctx,JSValue obj)

{
  int in_EDX;
  long in_RSI;
  JSObject *p;
  JSContext *in_stack_00000028;
  undefined1 in_stack_00000030 [16];
  undefined4 local_4;
  
  if (in_EDX == -1) {
    if (*(short *)(in_RSI + 6) == 0x29) {
      local_4 = js_proxy_preventExtensions(in_stack_00000028,(JSValue)in_stack_00000030);
    }
    else {
      *(byte *)(in_RSI + 5) = *(byte *)(in_RSI + 5) & 0xfe;
      local_4 = 1;
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int JS_PreventExtensions(JSContext *ctx, JSValueConst obj)
{
    JSObject *p;

    if (unlikely(JS_VALUE_GET_TAG(obj) != JS_TAG_OBJECT))
        return FALSE;
    p = JS_VALUE_GET_OBJ(obj);
    if (unlikely(p->class_id == JS_CLASS_PROXY))
        return js_proxy_preventExtensions(ctx, obj);
    p->extensible = FALSE;
    return TRUE;
}